

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeGuardCommand.cxx
# Opt level: O0

string * anon_unknown.dwarf_8c4494::GetIncludeGuardVariableName
                   (string *__return_storage_ptr__,string *filePath)

{
  string local_50;
  allocator<char> local_1a;
  undefined1 local_19;
  string *local_18;
  string *filePath_local;
  string *result;
  
  local_19 = 0;
  local_18 = filePath;
  filePath_local = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"__INCGUARD_",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  cmSystemTools::ComputeStringMD5(&local_50,local_18);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"__");
  return __return_storage_ptr__;
}

Assistant:

std::string GetIncludeGuardVariableName(std::string const& filePath)
{
  std::string result = "__INCGUARD_";
#ifndef CMAKE_BOOTSTRAP
  result += cmSystemTools::ComputeStringMD5(filePath);
#else
  result += cmSystemTools::MakeCidentifier(filePath);
#endif
  result += "__";
  return result;
}